

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseCop2BranchCondition(MipsParser *this,Parser *parser,int *result)

{
  int64_t iVar1;
  Identifier *this_00;
  string *text;
  size_t local_38;
  size_t pos;
  Token *token;
  int *result_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  token = (Token *)result;
  result_local = (int *)parser;
  parser_local = (Parser *)this;
  pos = (size_t)Parser::nextToken(parser);
  if (((Token *)pos)->type == Integer) {
    iVar1 = Token::intValue((Token *)pos);
    *(int *)&token->line = (int)iVar1;
    iVar1 = Token::intValue((Token *)pos);
    this_local._7_1_ = iVar1 < 6;
  }
  else if (((Token *)pos)->type == Identifier) {
    local_38 = 0;
    this_00 = Token::identifierValue((Token *)pos);
    text = Identifier::string_abi_cxx11_(this_00);
    this_local._7_1_ = decodeCop2BranchCondition(this,text,&local_38,(int *)token);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::parseCop2BranchCondition(Parser& parser, int& result)
{
	const Token& token = parser.nextToken();

	if (token.type == TokenType::Integer)
	{
		result = (int) token.intValue();
		return token.intValue() <= 5;
	}

	if (token.type != TokenType::Identifier)
		return false;

	size_t pos = 0;
	return decodeCop2BranchCondition(token.identifierValue().string(),pos,result);
}